

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tools_common.c
# Opt level: O1

void aom_img_downshift(aom_image_t *dst,aom_image_t *src,int down_shift)

{
  aom_img_fmt_t aVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  aom_img_fmt_t aVar5;
  uint uVar6;
  uint uVar7;
  long lVar8;
  uint uVar9;
  ulong uVar10;
  uint uVar11;
  uint uVar12;
  uchar *puVar13;
  uchar *puVar14;
  long lVar15;
  
  aVar1 = dst->fmt;
  uVar9 = src->d_w;
  if ((aVar1 >> 0xb & 1) == 0) {
    if ((((dst->d_w != uVar9) || (dst->d_h != src->d_h)) ||
        (dst->x_chroma_shift != src->x_chroma_shift)) ||
       (((dst->y_chroma_shift != src->y_chroma_shift || (down_shift < 0)) ||
        ((src->fmt != (aVar1 | 0x800) ||
         ((1 < aVar1 - AOM_IMG_FMT_I422 && (aVar1 != AOM_IMG_FMT_I420)))))))) {
LAB_00121f11:
      fatal("Unsupported image conversion");
    }
    lVar8 = 0;
    do {
      uVar9 = src->d_w;
      uVar11 = src->d_h;
      if (lVar8 != 0) {
        uVar9 = uVar9 + src->x_chroma_shift >> ((byte)src->x_chroma_shift & 0x1f);
        uVar11 = uVar11 + src->y_chroma_shift >> ((byte)src->y_chroma_shift & 0x1f);
      }
      if (0 < (int)uVar11) {
        uVar12 = 0;
        do {
          if (0 < (int)uVar9) {
            iVar2 = dst->stride[lVar8];
            puVar14 = dst->planes[lVar8];
            iVar3 = src->stride[lVar8];
            puVar13 = src->planes[lVar8];
            lVar15 = 0;
            do {
              puVar14[lVar15 + (int)(iVar2 * uVar12)] =
                   (uchar)(*(ushort *)(puVar13 + lVar15 * 2 + (long)(int)(iVar3 * uVar12)) >>
                          ((byte)down_shift & 0x1f));
              lVar15 = lVar15 + 1;
            } while (uVar9 != (uint)lVar15);
          }
          uVar12 = uVar12 + 1;
        } while (uVar12 != uVar11);
      }
      lVar8 = lVar8 + 1;
    } while (lVar8 != 3);
  }
  else {
    if (((((dst->d_w != uVar9) || (uVar11 = src->d_h, dst->d_h != uVar11)) ||
         (uVar12 = src->x_chroma_shift, dst->x_chroma_shift != uVar12)) ||
        ((uVar4 = src->y_chroma_shift, dst->y_chroma_shift != uVar4 || (down_shift < 0)))) ||
       ((aVar5 = src->fmt, aVar1 != aVar5 ||
        ((1 < aVar5 - AOM_IMG_FMT_I42216 && (aVar5 != AOM_IMG_FMT_I42016)))))) goto LAB_00121f11;
    lVar8 = 0;
    do {
      uVar7 = uVar4 + uVar11 >> ((byte)uVar4 & 0x1f);
      uVar6 = uVar12 + uVar9 >> ((byte)uVar12 & 0x1f);
      if (lVar8 == 0) {
        uVar7 = uVar11;
        uVar6 = uVar9;
      }
      if (0 < (int)uVar7) {
        puVar14 = src->planes[lVar8];
        iVar2 = src->stride[lVar8];
        puVar13 = dst->planes[lVar8];
        iVar3 = dst->stride[lVar8];
        uVar10 = 0;
        do {
          if (0 < (int)uVar6) {
            lVar15 = 0;
            do {
              *(ushort *)(puVar13 + lVar15 * 2) =
                   *(ushort *)(puVar14 + lVar15 * 2) >> ((byte)down_shift & 0x1f);
              lVar15 = lVar15 + 1;
            } while (uVar6 != (uint)lVar15);
          }
          uVar10 = uVar10 + 1;
          puVar13 = puVar13 + iVar3;
          puVar14 = puVar14 + iVar2;
        } while (uVar10 != uVar7);
      }
      lVar8 = lVar8 + 1;
    } while (lVar8 != 3);
  }
  return;
}

Assistant:

void aom_img_downshift(aom_image_t *dst, const aom_image_t *src,
                       int down_shift) {
  if (dst->fmt & AOM_IMG_FMT_HIGHBITDEPTH) {
    highbd_img_downshift(dst, src, down_shift);
  } else {
    lowbd_img_downshift(dst, src, down_shift);
  }
}